

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.h
# Opt level: O2

buffer_type * __thiscall
rest_rpc::rpc_service::msgpack_codec::pack_args<char_const(&)[6]>
          (buffer_type *__return_storage_ptr__,msgpack_codec *this,char (*args) [6])

{
  tuple<const_char_(&)[6]> local_18;
  
  msgpack::v1::sbuffer::sbuffer(__return_storage_ptr__,0x800);
  local_18.super__Tuple_impl<0UL,_const_char_(&)[6]>.super__Head_base<0UL,_const_char_(&)[6],_false>
  ._M_head_impl = (_Tuple_impl<0UL,_const_char_(&)[6]>)(_Tuple_impl<0UL,_const_char_(&)[6]>)this;
  msgpack::v1::pack<msgpack::v1::sbuffer,std::tuple<char_const(&)[6]>>
            (__return_storage_ptr__,&local_18);
  return __return_storage_ptr__;
}

Assistant:

static buffer_type pack_args(Args &&...args) {
    buffer_type buffer(init_size);
    msgpack::pack(buffer, std::forward_as_tuple(std::forward<Args>(args)...));
    return buffer;
  }